

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall
cmGeneratorTarget::GetFeature(cmGeneratorTarget *this,string *feature,string *config)

{
  char *pcVar1;
  string featureConfig;
  string local_60;
  string local_40;
  
  if (config->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_60,(string *)feature);
    std::__cxx11::string::append((char *)&local_60);
    cmsys::SystemTools::UpperCase(&local_40,config);
    std::__cxx11::string::append((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    pcVar1 = GetProperty(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
  }
  pcVar1 = GetProperty(this,feature);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = cmLocalGenerator::GetFeature(this->LocalGenerator,feature,config);
  }
  return pcVar1;
}

Assistant:

const char* cmGeneratorTarget::GetFeature(const std::string& feature,
                                          const std::string& config) const
{
  if (!config.empty()) {
    std::string featureConfig = feature;
    featureConfig += "_";
    featureConfig += cmSystemTools::UpperCase(config);
    if (const char* value = this->GetProperty(featureConfig)) {
      return value;
    }
  }
  if (const char* value = this->GetProperty(feature)) {
    return value;
  }
  return this->LocalGenerator->GetFeature(feature, config);
}